

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O3

int __thiscall BMP::read_s32(BMP *this,FILE *fp)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  
  uVar1 = getc((FILE *)fp);
  uVar2 = getc((FILE *)fp);
  uVar3 = getc((FILE *)fp);
  iVar4 = getc((FILE *)fp);
  return iVar4 << 0x18 | (uVar3 & 0xff) << 0x10 | (uVar2 & 0xff) << 8 | uVar1 & 0xff;
}

Assistant:

int BMP::read_s32( FILE *fp )
{
    unsigned char b0, b1, b2, b3;

    b0 = ( unsigned char )getc( fp );
    b1 = ( unsigned char )getc( fp );
    b2 = ( unsigned char )getc( fp );
    b3 = ( unsigned char )getc( fp );

    return ( ( int )( ( ( ( ( b3 << 8 ) | b2 ) << 8 ) | b1 ) << 8 ) | b0 );
}